

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O1

ion_err_t ion_find_by_use_master_table
                    (ion_dictionary_config_info_t *config,ion_dict_use_t use_type,char whence)

{
  ion_err_t iVar1;
  undefined3 in_register_00000011;
  uint uVar2;
  ion_dictionary_config_info_t tconfig;
  ion_dictionary_config_info_t local_50;
  
  uVar2 = 1;
  if (whence == -1) {
    uVar2 = ion_master_table_next_id - 1;
  }
  if (uVar2 == 0 || ion_master_table_next_id <= uVar2) {
    return '\x01';
  }
  do {
    local_50.id = uVar2;
    iVar1 = ion_master_table_read(&local_50,-1);
    if (iVar1 != '\x01') {
      if (iVar1 != '\0') {
        return iVar1;
      }
      if (local_50.use_type == use_type) {
        config->value_size = local_50.value_size;
        config->dictionary_size = local_50.dictionary_size;
        config->dictionary_type = local_50.dictionary_type;
        config->dictionary_status = local_50.dictionary_status;
        *(undefined3 *)&config->field_0x1d = local_50._29_3_;
        config->id = local_50.id;
        config->use_type = local_50.use_type;
        *(int3 *)&config->field_0x5 = local_50._5_3_;
        config->type = local_50.type;
        config->key_size = local_50.key_size;
        return '\0';
      }
    }
    uVar2 = uVar2 + CONCAT31(in_register_00000011,whence);
    if (uVar2 == 0) {
      return '\x01';
    }
  } while (uVar2 < ion_master_table_next_id);
  return '\x01';
}

Assistant:

ion_err_t
ion_find_by_use_master_table(
	ion_dictionary_config_info_t	*config,
	ion_dict_use_t					use_type,
	char							whence
) {
	ion_dictionary_id_t				id;
	ion_dictionary_config_info_t	tconfig;
	ion_err_t						error;

	tconfig.id	= 0;

	id			= 1;

	if (ION_MASTER_TABLE_FIND_LAST == whence) {
		id = ion_master_table_next_id - 1;
	}

	/* Loop through all items. */
	for (; id < ion_master_table_next_id && id > 0; id += whence) {
		error = ion_lookup_in_master_table(id, &tconfig);

		if (err_item_not_found == error) {
			continue;
		}

		if (err_ok != error) {
			return error;
		}

		/* If this config has the right type, set the output pointer. */
		if (tconfig.use_type == use_type) {
			*config = tconfig;

			return err_ok;
		}
	}

	return err_item_not_found;
}